

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O2

string * __thiscall
testing::internal::String::FormatByte_abi_cxx11_
          (string *__return_storage_ptr__,String *this,uchar value)

{
  long lVar1;
  ostream *poVar2;
  stringstream ss;
  undefined1 local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_188,0x30);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
  *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) | 0x4000;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatByte(unsigned char value) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(2) << std::hex << std::uppercase
     << static_cast<unsigned int>(value);
  return ss.str();
}